

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitMatrix.cpp
# Opt level: O0

BitMatrix * ZXing::Inflate(BitMatrix *input,int width,int height,int quietZone)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  BitMatrix *in_RSI;
  BitMatrix *in_RDI;
  int in_R8D;
  int outputX;
  int inputX;
  int outputY;
  int inputY;
  int topPadding;
  int leftPadding;
  int scale;
  int outputHeight;
  int outputWidth;
  int codeHeight;
  int codeWidth;
  BitMatrix *result;
  int in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  int local_68;
  int in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  int in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  int iVar5;
  int iVar6;
  uint in_stack_ffffffffffffffb4;
  uint uVar7;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  BitMatrix *local_10;
  
  local_1c = in_R8D;
  local_10 = in_RSI;
  local_20 = BitMatrix::width(in_RSI);
  local_24 = BitMatrix::height(local_10);
  local_2c = local_20 + local_1c * 2;
  piVar4 = std::max<int>(&local_14,&local_2c);
  local_28 = *piVar4;
  local_34 = local_24 + local_1c * 2;
  piVar4 = std::max<int>(&local_18,&local_34);
  local_30 = *piVar4;
  iVar2 = BitMatrix::width(local_10);
  if ((iVar2 == local_28) && (iVar2 = BitMatrix::height(local_10), iVar2 == local_30)) {
    BitMatrix::BitMatrix
              ((BitMatrix *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               (BitMatrix *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  }
  else {
    local_3c = (local_28 + local_1c * -2) / local_20;
    local_40 = (local_30 + local_1c * -2) / local_24;
    piVar4 = std::min<int>(&local_3c,&local_40);
    local_38 = *piVar4;
    iVar2 = (local_30 - local_24 * local_38) / 2;
    uVar7 = in_stack_ffffffffffffffb4 & 0xffffff;
    BitMatrix::BitMatrix
              ((BitMatrix *)
               (CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0) & 0xffffffffffffff),
               in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
    iVar5 = 0;
    while (iVar6 = iVar5, iVar3 = BitMatrix::height(local_10), iVar5 < iVar3) {
      local_68 = 0;
      while (iVar5 = local_68, iVar3 = BitMatrix::width(local_10), iVar5 < iVar3) {
        bVar1 = BitMatrix::get((BitMatrix *)CONCAT44(iVar3,iVar5),in_stack_ffffffffffffff6c,
                               in_stack_ffffffffffffff68);
        in_stack_ffffffffffffff6c = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff6c);
        if (bVar1) {
          BitMatrix::setRegion
                    ((BitMatrix *)CONCAT44(uVar7,iVar6),iVar2,in_stack_ffffffffffffffa8,
                     in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0);
        }
        local_68 = local_68 + 1;
      }
      iVar2 = local_38 + iVar2;
      iVar5 = iVar6 + 1;
    }
  }
  return in_RDI;
}

Assistant:

BitMatrix Inflate(BitMatrix&& input, int width, int height, int quietZone)
{
	const int codeWidth = input.width();
	const int codeHeight = input.height();
	const int outputWidth = std::max(width, codeWidth + 2 * quietZone);
	const int outputHeight = std::max(height, codeHeight + 2 * quietZone);

	if (input.width() == outputWidth && input.height() == outputHeight)
		return std::move(input);

	const int scale = std::min((outputWidth - 2*quietZone) / codeWidth, (outputHeight - 2*quietZone) / codeHeight);
	// Padding includes both the quiet zone and the extra white pixels to
	// accommodate the requested dimensions.
	const int leftPadding = (outputWidth - (codeWidth * scale)) / 2;
	const int topPadding = (outputHeight - (codeHeight * scale)) / 2;

	BitMatrix result(outputWidth, outputHeight);

	for (int inputY = 0, outputY = topPadding; inputY < input.height(); ++inputY, outputY += scale) {
		for (int inputX = 0, outputX = leftPadding; inputX < input.width(); ++inputX, outputX += scale) {
			if (input.get(inputX, inputY))
				result.setRegion(outputX, outputY, scale, scale);
		}
	}

	return result;
}